

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit_p.h
# Opt level: O0

void __thiscall QTextEditPrivate::sendControlEvent(QTextEditPrivate *this,QEvent *e)

{
  int iVar1;
  QPointF *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  double xpos;
  QTextEditPrivate *in_stack_ffffffffffffffb0;
  QWidget *contextWidget;
  QPointF *this_00;
  QPointF *this_01;
  QPointF local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  contextWidget = *(QWidget **)(in_RDI + 0x2f8);
  this_01 = in_RSI;
  iVar1 = horizontalOffset(in_stack_ffffffffffffffb0);
  xpos = (double)iVar1;
  iVar1 = verticalOffset((QTextEditPrivate *)0x6d8c89);
  this_00 = &local_18;
  QPointF::QPointF(this_00,xpos,(double)iVar1);
  QWidgetTextControl::processEvent
            ((QWidgetTextControl *)this_01,(QEvent *)this_00,in_RSI,contextWidget);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void sendControlEvent(QEvent *e)
    { control->processEvent(e, QPointF(horizontalOffset(), verticalOffset()), viewport); }